

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O1

void tree_push(tree *t,char *path,wchar_t filesystem_id,int64_t dev,int64_t ino,restore_time *rt)

{
  tree_entry *ptVar1;
  tree_entry *ptVar2;
  size_t n;
  
  ptVar2 = (tree_entry *)calloc(1,0x88);
  if (ptVar2 != (tree_entry *)0x0) {
    ptVar2->next = t->stack;
    ptVar1 = t->current;
    ptVar2->parent = ptVar1;
    if (ptVar1 != (tree_entry *)0x0) {
      ptVar2->depth = ptVar1->depth + 1;
    }
    t->stack = ptVar2;
    (ptVar2->name).s = (char *)0x0;
    (ptVar2->name).length = 0;
    n = 0;
    (ptVar2->name).buffer_length = 0;
    ptVar2->symlink_parent_fd = -1;
    (ptVar2->name).length = 0;
    if (path != (char *)0x0) {
      n = strlen(path);
    }
    archive_strncat(&ptVar2->name,path,n);
    ptVar2->flags = 0x38;
    ptVar2->filesystem_id = filesystem_id;
    ptVar2->dev = dev;
    ptVar2->ino = ino;
    ptVar2->dirname_length = t->dirname_length;
    (ptVar2->restore_time).name = (ptVar2->name).s;
    if (rt != (restore_time *)0x0) {
      (ptVar2->restore_time).mtime = rt->mtime;
      (ptVar2->restore_time).mtime_nsec = rt->mtime_nsec;
      (ptVar2->restore_time).atime = rt->atime;
      (ptVar2->restore_time).atime_nsec = rt->atime_nsec;
      (ptVar2->restore_time).filetype = rt->filetype;
      (ptVar2->restore_time).noatime = rt->noatime;
    }
    return;
  }
  __archive_errx(1,"Out of memory");
}

Assistant:

static void
tree_push(struct tree *t, const char *path, int filesystem_id,
    int64_t dev, int64_t ino, struct restore_time *rt)
{
	struct tree_entry *te;

	te = calloc(1, sizeof(*te));
	if (te == NULL)
		__archive_errx(1, "Out of memory");
	te->next = t->stack;
	te->parent = t->current;
	if (te->parent)
		te->depth = te->parent->depth + 1;
	t->stack = te;
	archive_string_init(&te->name);
	te->symlink_parent_fd = -1;
	archive_strcpy(&te->name, path);
	te->flags = needsDescent | needsOpen | needsAscent;
	te->filesystem_id = filesystem_id;
	te->dev = dev;
	te->ino = ino;
	te->dirname_length = t->dirname_length;
	te->restore_time.name = te->name.s;
	if (rt != NULL) {
		te->restore_time.mtime = rt->mtime;
		te->restore_time.mtime_nsec = rt->mtime_nsec;
		te->restore_time.atime = rt->atime;
		te->restore_time.atime_nsec = rt->atime_nsec;
		te->restore_time.filetype = rt->filetype;
		te->restore_time.noatime = rt->noatime;
	}
}